

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<std::optional<long>const&>::operator>
          (result *__return_storage_ptr__,expression_lhs<std::optional<long>const&> *this,
          optional<char> *rhs)

{
  lest *this_00;
  bool bVar1;
  optional<char> *in_R8;
  allocator<char> local_69;
  string local_68;
  string local_48 [32];
  
  this_00 = *(lest **)this;
  if (this_00[8] == (lest)0x1) {
    bVar1 = true;
    if ((rhs->super__Optional_base<char,_true,_true>)._M_payload.super__Optional_payload_base<char>.
        _M_engaged == true) {
      bVar1 = (long)(rhs->super__Optional_base<char,_true,_true>)._M_payload.
                    super__Optional_payload_base<char>._M_payload._M_value < *(long *)this_00;
    }
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>(local_48,">",&local_69);
  to_string<std::optional<long>,std::optional<char>>
            (&local_68,this_00,(optional<long> *)local_48,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = bVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }